

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

bool AI::areAdjacent(Task *a,Task *b)

{
  WorldStateIdentifier WVar1;
  SatisfiablePredicateIdentifier SVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  pointer pSVar8;
  pointer pSVar9;
  pointer pSVar10;
  pointer pCVar11;
  ConsumableFact *pCVar12;
  bool bVar13;
  pointer pRVar14;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  _Var15;
  pointer pSVar16;
  pointer pRVar17;
  bool bVar18;
  pointer pRVar19;
  long lVar20;
  RequiredValue *value;
  pointer pRVar21;
  pointer pSVar22;
  pointer pRVar23;
  long lVar24;
  pointer pRVar25;
  pointer pSVar26;
  pointer pCVar27;
  bool bVar28;
  ConsumableFact vector;
  ConsumableFact local_48;
  ConsumableFact local_44;
  Task *local_40;
  ConsumableFact local_34;
  
  pRVar14 = (a->preconditions).requiredFlags.
            super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar3 = (a->preconditions).requiredFlags.
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar14 != pRVar3) {
    pRVar4 = (b->postconditions).requiredFlags.
             super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar5 = (b->postconditions).requiredFlags.
             super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar20 = (long)pRVar5 - (long)pRVar4 >> 5;
    do {
      WVar1 = pRVar14->id;
      pRVar23 = pRVar4 + 2;
      pRVar25 = pRVar4;
      lVar24 = lVar20 + 1;
      if (0 < lVar20) {
        do {
          if (pRVar23[-2].id == WVar1) {
            pRVar23 = pRVar23 + -2;
            goto LAB_00119818;
          }
          if (pRVar23[-1].id == WVar1) {
            pRVar23 = pRVar23 + -1;
            goto LAB_00119818;
          }
          if (pRVar23->id == WVar1) goto LAB_00119818;
          if (pRVar23[1].id == WVar1) {
            pRVar23 = pRVar23 + 1;
            goto LAB_00119818;
          }
          lVar24 = lVar24 + -1;
          pRVar23 = pRVar23 + 4;
          pRVar25 = (pointer)((long)&pRVar4->id +
                             ((long)pRVar5 - (long)pRVar4 & 0xffffffffffffffe0U));
        } while (1 < lVar24);
      }
      lVar24 = (long)pRVar5 - (long)pRVar25 >> 3;
      if (lVar24 == 1) {
LAB_001197fc:
        pRVar23 = pRVar25;
        if (pRVar25->id != WVar1) {
          pRVar23 = pRVar5;
        }
      }
      else if (lVar24 == 2) {
LAB_001197f3:
        pRVar23 = pRVar25;
        if (pRVar25->id != WVar1) {
          pRVar25 = pRVar25 + 1;
          goto LAB_001197fc;
        }
      }
      else {
        pRVar23 = pRVar5;
        if ((lVar24 == 3) && (pRVar23 = pRVar25, pRVar25->id != WVar1)) {
          pRVar25 = pRVar25 + 1;
          goto LAB_001197f3;
        }
      }
LAB_00119818:
      if ((pRVar23 != pRVar5) && (pRVar14->flag == pRVar23->flag)) {
        return true;
      }
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 != pRVar3);
  }
  pRVar6 = (a->preconditions).requiredValues.
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar18 = true;
  local_40 = a;
  for (pRVar21 = (a->preconditions).requiredValues.
                 super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
                 super__Vector_impl_data._M_start; bVar28 = pRVar21 == pRVar6, !bVar28;
      pRVar21 = pRVar21 + 1) {
    pRVar17 = (b->postconditions).requiredValues.
              super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar7 = (b->postconditions).requiredValues.
             super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    WVar1 = pRVar21->id;
    lVar20 = ((long)pRVar7 - (long)pRVar17 >> 2) * -0x5555555555555555 >> 2;
    pRVar19 = pRVar17;
    if (0 < lVar20) {
      pRVar19 = pRVar17 + lVar20 * 4;
      lVar20 = lVar20 + 1;
      pRVar17 = pRVar17 + 2;
      do {
        if (pRVar17[-2].id == WVar1) {
          pRVar17 = pRVar17 + -2;
          goto LAB_0011990e;
        }
        if (pRVar17[-1].id == WVar1) {
          pRVar17 = pRVar17 + -1;
          goto LAB_0011990e;
        }
        if (pRVar17->id == WVar1) goto LAB_0011990e;
        if (pRVar17[1].id == WVar1) {
          pRVar17 = pRVar17 + 1;
          goto LAB_0011990e;
        }
        lVar20 = lVar20 + -1;
        pRVar17 = pRVar17 + 4;
      } while (1 < lVar20);
    }
    lVar20 = ((long)pRVar7 - (long)pRVar19 >> 2) * -0x5555555555555555;
    if (lVar20 == 1) {
LAB_001198f3:
      pRVar17 = pRVar19;
      if (pRVar19->id != WVar1) {
        pRVar17 = pRVar7;
      }
    }
    else if (lVar20 == 2) {
LAB_001198eb:
      pRVar17 = pRVar19;
      if (pRVar19->id != WVar1) {
        pRVar19 = pRVar19 + 1;
        goto LAB_001198f3;
      }
    }
    else {
      pRVar17 = pRVar7;
      if ((lVar20 == 3) && (pRVar17 = pRVar19, pRVar19->id != WVar1)) {
        pRVar19 = pRVar19 + 1;
        goto LAB_001198eb;
      }
    }
LAB_0011990e:
    bVar13 = true;
    if (pRVar17 != pRVar7) {
      switch(pRVar17->op) {
      case LessThan:
        bVar18 = canLessThanSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      case LessEqual:
        bVar18 = canLessEqualSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      case EqualTo:
        bVar18 = canEqualToSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      case NotEqualTo:
        bVar18 = canNotEqualToSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      case GreaterThan:
        bVar18 = canGreaterThanSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      case GreaterEqual:
        bVar18 = canGreaterEqualSatisfy(pRVar17->value,pRVar21->op,pRVar21->value);
        break;
      default:
        goto switchD_00119934_default;
      }
      bVar13 = false;
    }
switchD_00119934_default:
    if (!bVar13) break;
  }
  if (bVar28) {
    pSVar16 = (local_40->preconditions).satisfiedPredicates.
              super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (local_40->preconditions).satisfiedPredicates.
             super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar28 = pSVar16 == pSVar8;
    if (!bVar28) {
      pSVar9 = (b->postconditions).satisfiedPredicates.
               super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar10 = (b->postconditions).satisfiedPredicates.
                super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar20 = (long)pSVar10 - (long)pSVar9 >> 5;
      do {
        SVar2 = pSVar16->identifier;
        pSVar22 = pSVar9;
        lVar24 = lVar20 + 1;
        pSVar26 = pSVar9 + 2;
        if (0 < lVar20) {
          do {
            if (pSVar26[-2].identifier == SVar2) {
              pSVar26 = pSVar26 + -2;
              goto LAB_00119ab2;
            }
            if (pSVar26[-1].identifier == SVar2) {
              pSVar26 = pSVar26 + -1;
              goto LAB_00119ab2;
            }
            if (pSVar26->identifier == SVar2) goto LAB_00119ab2;
            if (pSVar26[1].identifier == SVar2) {
              pSVar26 = pSVar26 + 1;
              goto LAB_00119ab2;
            }
            lVar24 = lVar24 + -1;
            pSVar22 = (pointer)((long)&pSVar9->identifier +
                               ((long)pSVar10 - (long)pSVar9 & 0xffffffffffffffe0U));
            pSVar26 = pSVar26 + 4;
          } while (1 < lVar24);
        }
        lVar24 = (long)pSVar10 - (long)pSVar22 >> 3;
        if (lVar24 == 1) {
LAB_00119a95:
          pSVar26 = pSVar22;
          if (pSVar22->identifier != SVar2) {
            pSVar26 = pSVar10;
          }
        }
        else if (lVar24 == 2) {
LAB_00119a8b:
          pSVar26 = pSVar22;
          if (pSVar22->identifier != SVar2) {
            pSVar22 = pSVar22 + 1;
            goto LAB_00119a95;
          }
        }
        else {
          pSVar26 = pSVar10;
          if ((lVar24 == 3) && (pSVar26 = pSVar22, pSVar22->identifier != SVar2)) {
            pSVar22 = pSVar22 + 1;
            goto LAB_00119a8b;
          }
        }
LAB_00119ab2:
        bVar18 = (bool)(bVar18 | pSVar26 != pSVar10);
        if (pSVar26 != pSVar10) break;
        pSVar16 = pSVar16 + 1;
        bVar28 = pSVar16 == pSVar8;
      } while (!bVar28);
    }
    if (bVar28) {
      pCVar27 = (local_40->preconditions).consumableFlags.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar11 = (local_40->preconditions).consumableFlags.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar28 = pCVar27 == pCVar11;
      if (!bVar28) {
        local_44 = *pCVar27;
        _Var15 = std::
                 __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                           ((b->postconditions).consumableFlags.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (b->postconditions).consumableFlags.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        pCVar12 = (b->postconditions).consumableFlags.
                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        bVar18 = (bool)(_Var15._M_current != pCVar12 | bVar18);
        if (_Var15._M_current == pCVar12) {
          do {
            pCVar27 = pCVar27 + 1;
            bVar28 = pCVar27 == pCVar11;
            if (bVar28) break;
            local_44 = *pCVar27;
            _Var15 = std::
                     __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                               ((b->postconditions).consumableFlags.
                                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (b->postconditions).consumableFlags.
                                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                                _M_impl.super__Vector_impl_data._M_finish,&local_44);
            pCVar12 = (b->postconditions).consumableFlags.
                      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            bVar18 = (bool)(bVar18 | _Var15._M_current != pCVar12);
          } while (_Var15._M_current == pCVar12);
        }
      }
      if (bVar28) {
        pCVar27 = (local_40->preconditions).consumableValues.
                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar11 = (local_40->preconditions).consumableValues.
                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        bVar28 = pCVar27 == pCVar11;
        if (!bVar28) {
          local_48 = *pCVar27;
          _Var15 = std::
                   __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                             ((b->postconditions).consumableValues.
                              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (b->postconditions).consumableValues.
                              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
          pCVar12 = (b->postconditions).consumableValues.
                    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar18 = (bool)(_Var15._M_current != pCVar12 | bVar18);
          if (_Var15._M_current == pCVar12) {
            do {
              pCVar27 = pCVar27 + 1;
              bVar28 = pCVar27 == pCVar11;
              if (bVar28) break;
              local_48 = *pCVar27;
              _Var15 = std::
                       __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                                 ((b->postconditions).consumableValues.
                                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (b->postconditions).consumableValues.
                                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_48);
              pCVar12 = (b->postconditions).consumableValues.
                        super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              bVar18 = (bool)(bVar18 | _Var15._M_current != pCVar12);
            } while (_Var15._M_current == pCVar12);
          }
        }
        if (bVar28) {
          pCVar27 = (local_40->preconditions).consumableVectors.
                    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar11 = (local_40->preconditions).consumableVectors.
                    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (pCVar27 == pCVar11) {
            bVar18 = false;
          }
          else {
            bVar28 = bVar18;
            do {
              local_34 = *pCVar27;
              _Var15 = std::
                       __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                                 ((b->postconditions).consumableVectors.
                                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (b->postconditions).consumableVectors.
                                  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_34);
              pCVar12 = (b->postconditions).consumableVectors.
                        super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              bVar28 = (bool)(_Var15._M_current != pCVar12 | bVar28);
              if (_Var15._M_current != pCVar12) {
                return bVar28;
              }
              pCVar27 = pCVar27 + 1;
              bVar18 = false;
            } while (pCVar27 != pCVar11);
          }
        }
      }
    }
  }
  return bVar18;
}

Assistant:

bool areAdjacent(Task& a, Task& b)
	{
		auto& precondition = a.preconditions;		

		for (auto& flag : precondition.requiredFlags)
		{
			const auto& matchingFlag = std::find_if(begin(b.postconditions.requiredFlags), end(b.postconditions.requiredFlags),
				[flag](auto& f) {return f.id == flag.id;});

			if (matchingFlag != end(b.postconditions.requiredFlags))
			{
				if (flag.flag == matchingFlag->flag)
				{
					return true;
				}
			}
		}

		for (auto& value : precondition.requiredValues)
		{
			const auto& matchingValue = std::find_if(begin(b.postconditions.requiredValues), end(b.postconditions.requiredValues),
				[value](auto& v){return v.id == value.id;});

			if (matchingValue != end(b.postconditions.requiredValues))
			{
				switch(matchingValue->op)
				{
					case ConditionOp::LessThan
						:
					{
						return canLessThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterThan
						:
					{
						return canGreaterThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::EqualTo
						:
					{
						return canEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::NotEqualTo
						:
					{
						return canNotEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::LessEqual
						:
					{
						return canLessEqualSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterEqual
						:
					{
						return canGreaterEqualSatisfy(matchingValue->value, value.op, value.value);
					}
				}
			}
		}

		for (auto satisfiedPredicate : precondition.satisfiedPredicates)
		{
			const auto& it = std::find_if(begin(b.postconditions.satisfiedPredicates), end(b.postconditions.satisfiedPredicates),
				[satisfiedPredicate](auto& sp){return sp.identifier == satisfiedPredicate.identifier;});	
			
			if (it != end(b.postconditions.satisfiedPredicates))
			{
				return true;
			}
		}

		for (auto flag : precondition.consumableFlags)
		{
			if (std::find(begin(b.postconditions.consumableFlags), end(b.postconditions.consumableFlags), flag)
				!= end(b.postconditions.consumableFlags))
			{
				return true;
			}
		}

		for (auto value : precondition.consumableValues)
		{
			if (std::find(begin(b.postconditions.consumableValues), end(b.postconditions.consumableValues), value)
				!= end(b.postconditions.consumableValues))
			{
				return true;
			}
		}

		for (auto vector : precondition.consumableVectors)
		{
			if (std::find(begin(b.postconditions.consumableVectors), end(b.postconditions.consumableVectors), vector)
				!= end(b.postconditions.consumableVectors))
			{
				return true;
			}
		}

		return false;
	}